

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::MultipleReporters::testRunEnded(MultipleReporters *this,TestRunStats *testRunStats)

{
  bool bVar1;
  reference this_00;
  IStreamingReporter *pIVar2;
  __normal_iterator<Catch::Ptr<Catch::IStreamingReporter>_*,_std::vector<Catch::Ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Ptr<Catch::IStreamingReporter>_>_>_>
  local_38;
  __normal_iterator<const_Catch::Ptr<Catch::IStreamingReporter>_*,_std::vector<Catch::Ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Ptr<Catch::IStreamingReporter>_>_>_>
  local_30;
  const_iterator itEnd;
  __normal_iterator<const_Catch::Ptr<Catch::IStreamingReporter>_*,_std::vector<Catch::Ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Ptr<Catch::IStreamingReporter>_>_>_>
  local_20;
  const_iterator it;
  TestRunStats *testRunStats_local;
  MultipleReporters *this_local;
  
  it._M_current = (Ptr<Catch::IStreamingReporter> *)testRunStats;
  itEnd._M_current =
       (Ptr<Catch::IStreamingReporter> *)
       std::
       vector<Catch::Ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Ptr<Catch::IStreamingReporter>_>_>
       ::begin(&this->m_reporters);
  __gnu_cxx::
  __normal_iterator<Catch::Ptr<Catch::IStreamingReporter>const*,std::vector<Catch::Ptr<Catch::IStreamingReporter>,std::allocator<Catch::Ptr<Catch::IStreamingReporter>>>>
  ::__normal_iterator<Catch::Ptr<Catch::IStreamingReporter>*>
            ((__normal_iterator<Catch::Ptr<Catch::IStreamingReporter>const*,std::vector<Catch::Ptr<Catch::IStreamingReporter>,std::allocator<Catch::Ptr<Catch::IStreamingReporter>>>>
              *)&local_20,
             (__normal_iterator<Catch::Ptr<Catch::IStreamingReporter>_*,_std::vector<Catch::Ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Ptr<Catch::IStreamingReporter>_>_>_>
              *)&itEnd);
  local_38._M_current =
       (Ptr<Catch::IStreamingReporter> *)
       std::
       vector<Catch::Ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Ptr<Catch::IStreamingReporter>_>_>
       ::end(&this->m_reporters);
  __gnu_cxx::
  __normal_iterator<Catch::Ptr<Catch::IStreamingReporter>const*,std::vector<Catch::Ptr<Catch::IStreamingReporter>,std::allocator<Catch::Ptr<Catch::IStreamingReporter>>>>
  ::__normal_iterator<Catch::Ptr<Catch::IStreamingReporter>*>
            ((__normal_iterator<Catch::Ptr<Catch::IStreamingReporter>const*,std::vector<Catch::Ptr<Catch::IStreamingReporter>,std::allocator<Catch::Ptr<Catch::IStreamingReporter>>>>
              *)&local_30,&local_38);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    this_00 = __gnu_cxx::
              __normal_iterator<const_Catch::Ptr<Catch::IStreamingReporter>_*,_std::vector<Catch::Ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Ptr<Catch::IStreamingReporter>_>_>_>
              ::operator*(&local_20);
    pIVar2 = Ptr<Catch::IStreamingReporter>::operator->(this_00);
    (*(pIVar2->super_IShared).super_NonCopyable._vptr_NonCopyable[0xf])(pIVar2,it._M_current);
    __gnu_cxx::
    __normal_iterator<const_Catch::Ptr<Catch::IStreamingReporter>_*,_std::vector<Catch::Ptr<Catch::IStreamingReporter>,_std::allocator<Catch::Ptr<Catch::IStreamingReporter>_>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

virtual void testRunEnded( TestRunStats const& testRunStats ) CATCH_OVERRIDE {
        for( Reporters::const_iterator it = m_reporters.begin(), itEnd = m_reporters.end();
                it != itEnd;
                ++it )
            (*it)->testRunEnded( testRunStats );
    }